

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O0

int av1_alloc_context_buffers(AV1_COMMON *cm,int width,int height,BLOCK_SIZE min_partition_size)

{
  int iVar1;
  undefined1 in_CL;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  CommonModeInfoParams *mi_params;
  uint local_4;
  
  (**(code **)(in_RDI + 0x260))(in_RDI + 0x208,in_ESI,in_EDX,in_CL);
  iVar1 = alloc_mi((CommonModeInfoParams *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    (**(code **)(in_RDI + 0x260))(in_RDI + 0x208,0,0);
    av1_free_context_buffers((AV1_COMMON *)0x6a38b9);
  }
  local_4 = (uint)(iVar1 != 0);
  return local_4;
}

Assistant:

int av1_alloc_context_buffers(AV1_COMMON *cm, int width, int height,
                              BLOCK_SIZE min_partition_size) {
  CommonModeInfoParams *const mi_params = &cm->mi_params;
  mi_params->set_mb_mi(mi_params, width, height, min_partition_size);
  if (alloc_mi(mi_params)) goto fail;
  return 0;

fail:
  // clear the mi_* values to force a realloc on resync
  mi_params->set_mb_mi(mi_params, 0, 0, BLOCK_4X4);
  av1_free_context_buffers(cm);
  return 1;
}